

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2LFO::set(V2LFO *this,syVLFO *para)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  byte bVar5;
  float fVar6;
  undefined1 auVar7 [16];
  
  fVar6 = para->mode;
  this->mode = (int)fVar6;
  uVar1 = para->sync;
  uVar2 = para->egmode;
  auVar7._0_4_ = -(uint)((int)(float)uVar1 == 0);
  auVar7._4_4_ = -(uint)((int)(float)uVar1 == 0);
  auVar7._8_4_ = -(uint)((int)(float)uVar2 == 0);
  auVar7._12_4_ = -(uint)((int)(float)uVar2 == 0);
  uVar3 = movmskpd((int)fVar6,auVar7);
  bVar5 = (byte)uVar3 ^ 3;
  this->sync = (bool)(bVar5 & 1);
  this->eg = (bool)(bVar5 >> 1);
  fVar6 = exp2f((para->rate * 0.0078125 + -1.0) * 10.0);
  this->freq = (int)(fVar6 * 1.0737418e+09);
  this->cphase = (int)(para->phase * 0.0078125 * 2.1474836e+09) * 2;
  iVar4 = (int)para->pol;
  if (iVar4 == 2) {
    fVar6 = para->amp;
    this->gain = fVar6;
    fVar6 = fVar6 * -0.5;
  }
  else {
    if (iVar4 == 1) {
      fVar6 = -para->amp;
    }
    else {
      if (iVar4 != 0) {
        return;
      }
      fVar6 = para->amp;
    }
    this->gain = fVar6;
    fVar6 = 0.0;
  }
  this->dc = fVar6;
  return;
}

Assistant:

void set(const syVLFO *para)
    {
        mode = (int)para->mode;
        sync = (int)para->sync != 0;
        eg = (int)para->egmode != 0;
        freq = (int)(0.5f * fc32bit * calcfreq(para->rate / 128.0f));
        cphase = ftou32(para->phase / 128.0f);

        switch ((int)para->pol)
        {
        case 0: // +
            COVER("LFO pol +");
            gain = para->amp;
            dc = 0.0f;
            break;

        case 1: // -
            COVER("LFO pol -");
            gain = -para->amp;
            dc = 0.0f;
            break;

        case 2: // +/-
            COVER("LFO pol +/-");
            gain = para->amp;
            dc = -0.5f * para->amp;
            break;
        }
    }